

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_context_get_device_info_sink_callback__pulse
               (ma_pa_context *pPulseContext,ma_pa_sink_info *pInfo,int endOfList,void *pUserData)

{
  ma_format mVar1;
  ma_context_get_device_info_callback_data__pulse *pData;
  void *pUserData_local;
  int endOfList_local;
  ma_pa_sink_info *pInfo_local;
  ma_pa_context *pPulseContext_local;
  
  if (endOfList < 1) {
    if (pUserData == (void *)0x0) {
      __assert_fail("pData != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                    ,0x4b0c,
                    "void ma_context_get_device_info_sink_callback__pulse(ma_pa_context *, const ma_pa_sink_info *, int, void *)"
                   );
    }
    *(undefined4 *)((long)pUserData + 8) = 1;
    if (pInfo->name != (char *)0x0) {
      ma_strncpy_s(*pUserData,0x100,pInfo->name,0xffffffffffffffff);
    }
    if (pInfo->description != (char *)0x0) {
      ma_strncpy_s((char *)(*pUserData + 0x100),0x100,pInfo->description,0xffffffffffffffff);
    }
    *(uint *)(*pUserData + 0x21c) = (uint)(pInfo->sample_spec).channels;
    *(uint *)(*pUserData + 0x220) = (uint)(pInfo->sample_spec).channels;
    *(ma_uint32 *)(*pUserData + 0x224) = (pInfo->sample_spec).rate;
    *(ma_uint32 *)(*pUserData + 0x228) = (pInfo->sample_spec).rate;
    *(undefined4 *)(*pUserData + 0x200) = 1;
    mVar1 = ma_format_from_pulse((pInfo->sample_spec).format);
    *(ma_format *)(*pUserData + 0x204) = mVar1;
  }
  return;
}

Assistant:

static void ma_context_get_device_info_sink_callback__pulse(ma_pa_context* pPulseContext, const ma_pa_sink_info* pInfo, int endOfList, void* pUserData)
{
    ma_context_get_device_info_callback_data__pulse* pData = (ma_context_get_device_info_callback_data__pulse*)pUserData;

    if (endOfList > 0) {
        return;
    }

    MA_ASSERT(pData != NULL);
    pData->foundDevice = MA_TRUE;

    if (pInfo->name != NULL) {
        ma_strncpy_s(pData->pDeviceInfo->id.pulse, sizeof(pData->pDeviceInfo->id.pulse), pInfo->name, (size_t)-1);
    }

    if (pInfo->description != NULL) {
        ma_strncpy_s(pData->pDeviceInfo->name, sizeof(pData->pDeviceInfo->name), pInfo->description, (size_t)-1);
    }

    pData->pDeviceInfo->minChannels   = pInfo->sample_spec.channels;
    pData->pDeviceInfo->maxChannels   = pInfo->sample_spec.channels;
    pData->pDeviceInfo->minSampleRate = pInfo->sample_spec.rate;
    pData->pDeviceInfo->maxSampleRate = pInfo->sample_spec.rate;
    pData->pDeviceInfo->formatCount = 1;
    pData->pDeviceInfo->formats[0] = ma_format_from_pulse(pInfo->sample_spec.format);

    (void)pPulseContext; /* Unused. */
}